

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NearestNeighborsIndex::InternalSwap
          (NearestNeighborsIndex *this,NearestNeighborsIndex *other)

{
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  IndexTypeUnion IVar4;
  DistanceFunctionUnion DVar5;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->floatsamples_).super_RepeatedPtrFieldBase,
             &(other->floatsamples_).super_RepeatedPtrFieldBase);
  iVar1 = this->numberofdimensions_;
  this->numberofdimensions_ = other->numberofdimensions_;
  other->numberofdimensions_ = iVar1;
  IVar4 = this->IndexType_;
  this->IndexType_ = other->IndexType_;
  other->IndexType_ = IVar4;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  DVar5 = this->DistanceFunction_;
  this->DistanceFunction_ = other->DistanceFunction_;
  other->DistanceFunction_ = DVar5;
  uVar2 = this->_oneof_case_[1];
  this->_oneof_case_[1] = other->_oneof_case_[1];
  other->_oneof_case_[1] = uVar2;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void NearestNeighborsIndex::InternalSwap(NearestNeighborsIndex* other) {
  floatsamples_.InternalSwap(&other->floatsamples_);
  std::swap(numberofdimensions_, other->numberofdimensions_);
  std::swap(IndexType_, other->IndexType_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(DistanceFunction_, other->DistanceFunction_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}